

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir.cc
# Opt level: O1

void __thiscall Dir::Dir(Dir *this,string *path)

{
  pointer pcVar1;
  DIR *pDVar2;
  runtime_error *this_00;
  int *in_R9;
  char local_4c [4];
  string local_48;
  
  (this->path_)._M_dataplus._M_p = (pointer)&(this->path_).field_2;
  pcVar1 = (path->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + path->_M_string_length);
  pDVar2 = opendir((path->_M_dataplus)._M_p);
  this->dir_ = (DIR *)pDVar2;
  if (pDVar2 != (DIR *)0x0) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_4c[0] = '\b';
  local_4c[1] = '\0';
  local_4c[2] = '\0';
  local_4c[3] = '\0';
  util::str<char[39],char[85],char[2],int>
            (&local_48,(util *)"Assertion `dir_ != nullptr` failed at ",
             (char (*) [39])
             "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/lib/dir.cc",
             (char (*) [85])":",(char (*) [2])local_4c,in_R9);
  std::runtime_error::runtime_error(this_00,(string *)&local_48);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Dir::Dir(const std::string& path)
    : path_(path) {
  dir_ = opendir(path.c_str());
  ASSERT(dir_ != nullptr);
}